

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batchnorm_x86_avx2.cpp
# Opt level: O2

int __thiscall
ncnn::BatchNorm_x86_avx2::forward_inplace(BatchNorm_x86_avx2 *this,Mat *bottom_top_blob,Option *opt)

{
  undefined4 uVar1;
  undefined4 uVar2;
  _func_int **pp_Var3;
  undefined1 auVar4 [16];
  void *pvVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  undefined1 (*pauVar13) [32];
  undefined1 (*pauVar14) [16];
  int iVar15;
  uint uVar16;
  int q;
  long lVar17;
  bool bVar18;
  undefined1 auVar19 [16];
  undefined1 auVar21 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  Mat local_78;
  undefined1 auVar20 [32];
  undefined1 auVar22 [32];
  
  iVar6 = bottom_top_blob->dims;
  if (bottom_top_blob->elempack == 4) {
    if (iVar6 == 2) {
      uVar12 = 0;
      iVar10 = bottom_top_blob->w;
      if (bottom_top_blob->w < 1) {
        iVar10 = 0;
      }
      pp_Var3 = this->_vptr_BatchNorm_x86_avx2;
      uVar11 = (ulong)(uint)bottom_top_blob->h;
      if (bottom_top_blob->h < 1) {
        uVar11 = uVar12;
      }
      for (; uVar12 != uVar11; uVar12 = uVar12 + 1) {
        auVar19 = *(undefined1 (*) [16])
                   (*(long *)(&this->field_0x1f8 + (long)pp_Var3[-3]) + uVar12 * 0x10);
        auVar21 = *(undefined1 (*) [16])
                   (*(long *)(&this->field_0x240 + (long)pp_Var3[-3]) + uVar12 * 0x10);
        pauVar14 = (undefined1 (*) [16])
                   ((long)bottom_top_blob->w * uVar12 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        iVar15 = iVar10;
        while (bVar18 = iVar15 != 0, iVar15 = iVar15 + -1, bVar18) {
          auVar23 = vfmadd132ps_fma(*pauVar14,auVar19,auVar21);
          *pauVar14 = auVar23;
          pauVar14 = pauVar14 + 1;
        }
      }
    }
    else if (iVar6 == 1) {
      pp_Var3 = this->_vptr_BatchNorm_x86_avx2;
      uVar11 = 0;
      uVar12 = (ulong)(uint)bottom_top_blob->w;
      if (bottom_top_blob->w < 1) {
        uVar12 = uVar11;
      }
      for (; uVar12 * 0x10 != uVar11; uVar11 = uVar11 + 0x10) {
        auVar19 = vfmadd213ps_fma(*(undefined1 (*) [16])((long)bottom_top_blob->data + uVar11),
                                  *(undefined1 (*) [16])
                                   (*(long *)(&this->field_0x240 + (long)pp_Var3[-3]) + uVar11),
                                  *(undefined1 (*) [16])
                                   (*(long *)(&this->field_0x1f8 + (long)pp_Var3[-3]) + uVar11));
        *(undefined1 (*) [16])((long)bottom_top_blob->data + uVar11) = auVar19;
      }
    }
    if (iVar6 - 3U < 2) {
      uVar16 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
      uVar11 = 0;
      uVar12 = (ulong)uVar16;
      if ((int)uVar16 < 1) {
        uVar12 = uVar11;
      }
      uVar9 = (ulong)(uint)bottom_top_blob->c;
      if (bottom_top_blob->c < 1) {
        uVar9 = uVar11;
      }
      for (; uVar11 != uVar9; uVar11 = uVar11 + 1) {
        auVar21 = *(undefined1 (*) [16])
                   (*(long *)(&this->field_0x1f8 + (long)this->_vptr_BatchNorm_x86_avx2[-3]) +
                   uVar11 * 0x10);
        auVar19 = *(undefined1 (*) [16])
                   (*(long *)(&this->field_0x240 + (long)this->_vptr_BatchNorm_x86_avx2[-3]) +
                   uVar11 * 0x10);
        Mat::channel(&local_78,bottom_top_blob,(int)uVar11);
        pauVar13 = (undefined1 (*) [32])local_78.data;
        Mat::~Mat(&local_78);
        uVar8 = uVar12;
        while (iVar6 = (int)uVar8, uVar8 = (ulong)(iVar6 - 1), iVar6 != 0) {
          auVar23 = vfmadd132ps_fma(*(undefined1 (*) [16])*pauVar13,auVar21,auVar19);
          *(undefined1 (*) [16])*pauVar13 = auVar23;
          pauVar13 = (undefined1 (*) [32])(*pauVar13 + 0x10);
        }
      }
    }
  }
  else if (bottom_top_blob->elempack == 8) {
    if (iVar6 == 2) {
      uVar12 = 0;
      iVar10 = bottom_top_blob->w;
      if (bottom_top_blob->w < 1) {
        iVar10 = 0;
      }
      pp_Var3 = this->_vptr_BatchNorm_x86_avx2;
      uVar11 = (ulong)(uint)bottom_top_blob->h;
      if (bottom_top_blob->h < 1) {
        uVar11 = uVar12;
      }
      for (; uVar12 != uVar11; uVar12 = uVar12 + 1) {
        auVar20 = *(undefined1 (*) [32])
                   (*(long *)(&this->field_0x1f8 + (long)pp_Var3[-3]) + uVar12 * 0x20);
        auVar22 = *(undefined1 (*) [32])
                   (*(long *)(&this->field_0x240 + (long)pp_Var3[-3]) + uVar12 * 0x20);
        pauVar13 = (undefined1 (*) [32])
                   ((long)bottom_top_blob->w * uVar12 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        iVar15 = iVar10;
        while (bVar18 = iVar15 != 0, iVar15 = iVar15 + -1, bVar18) {
          auVar19 = vfmadd132ps_fma(*pauVar13,auVar20,auVar22);
          *pauVar13 = ZEXT1632(auVar19);
          pauVar13 = pauVar13 + 1;
        }
      }
    }
    else if (iVar6 == 1) {
      pp_Var3 = this->_vptr_BatchNorm_x86_avx2;
      uVar11 = 0;
      uVar12 = (ulong)(uint)bottom_top_blob->w;
      if (bottom_top_blob->w < 1) {
        uVar12 = uVar11;
      }
      for (; uVar12 * 0x20 != uVar11; uVar11 = uVar11 + 0x20) {
        auVar19 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)bottom_top_blob->data + uVar11),
                                  *(undefined1 (*) [32])
                                   (*(long *)(&this->field_0x240 + (long)pp_Var3[-3]) + uVar11),
                                  *(undefined1 (*) [32])
                                   (*(long *)(&this->field_0x1f8 + (long)pp_Var3[-3]) + uVar11));
        *(undefined1 (*) [32])((long)bottom_top_blob->data + uVar11) = ZEXT1632(auVar19);
      }
    }
    if (iVar6 - 3U < 2) {
      uVar16 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
      uVar11 = 0;
      uVar12 = (ulong)uVar16;
      if ((int)uVar16 < 1) {
        uVar12 = uVar11;
      }
      uVar9 = (ulong)(uint)bottom_top_blob->c;
      if (bottom_top_blob->c < 1) {
        uVar9 = uVar11;
      }
      for (; uVar11 != uVar9; uVar11 = uVar11 + 1) {
        auVar22 = *(undefined1 (*) [32])
                   (*(long *)(&this->field_0x1f8 + (long)this->_vptr_BatchNorm_x86_avx2[-3]) +
                   uVar11 * 0x20);
        auVar20 = *(undefined1 (*) [32])
                   (*(long *)(&this->field_0x240 + (long)this->_vptr_BatchNorm_x86_avx2[-3]) +
                   uVar11 * 0x20);
        Mat::channel(&local_78,bottom_top_blob,(int)uVar11);
        pauVar13 = (undefined1 (*) [32])local_78.data;
        Mat::~Mat(&local_78);
        uVar8 = uVar12;
        while (iVar6 = (int)uVar8, uVar8 = (ulong)(iVar6 - 1), iVar6 != 0) {
          auVar19 = vfmadd132ps_fma(*pauVar13,auVar22,auVar20);
          *pauVar13 = ZEXT1632(auVar19);
          pauVar13 = pauVar13 + 1;
        }
      }
    }
  }
  else {
    if (iVar6 - 5U < 0xfffffffe) {
      iVar6 = BatchNorm::forward_inplace
                        ((BatchNorm *)
                         ((long)&this->_vptr_BatchNorm_x86_avx2 +
                         (long)this->_vptr_BatchNorm_x86_avx2[-3]),bottom_top_blob,opt);
      return iVar6;
    }
    iVar6 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
    for (lVar17 = 0; lVar17 < *(int *)(&this->field_0xd0 + (long)this->_vptr_BatchNorm_x86_avx2[-3])
        ; lVar17 = lVar17 + 1) {
      Mat::channel(&local_78,bottom_top_blob,(int)lVar17);
      pvVar5 = local_78.data;
      Mat::~Mat(&local_78);
      uVar1 = *(undefined4 *)
               (*(long *)(&this->field_0x1f8 + (long)this->_vptr_BatchNorm_x86_avx2[-3]) +
               lVar17 * 4);
      auVar19._4_4_ = uVar1;
      auVar19._0_4_ = uVar1;
      auVar19._8_4_ = uVar1;
      auVar19._12_4_ = uVar1;
      auVar20._16_4_ = uVar1;
      auVar20._0_16_ = auVar19;
      auVar20._20_4_ = uVar1;
      auVar20._24_4_ = uVar1;
      auVar20._28_4_ = uVar1;
      uVar2 = *(undefined4 *)
               (*(long *)(&this->field_0x240 + (long)this->_vptr_BatchNorm_x86_avx2[-3]) +
               lVar17 * 4);
      auVar21._4_4_ = uVar2;
      auVar21._0_4_ = uVar2;
      auVar21._8_4_ = uVar2;
      auVar21._12_4_ = uVar2;
      auVar22._16_4_ = uVar2;
      auVar22._0_16_ = auVar21;
      auVar22._20_4_ = uVar2;
      auVar22._24_4_ = uVar2;
      auVar22._28_4_ = uVar2;
      lVar7 = 0;
      pauVar13 = (undefined1 (*) [32])pvVar5;
      for (iVar10 = 0; iVar10 + 7 < iVar6; iVar10 = iVar10 + 8) {
        auVar23 = vfmadd132ps_fma(*pauVar13,auVar20,auVar22);
        *pauVar13 = ZEXT1632(auVar23);
        pauVar13 = pauVar13 + 1;
        lVar7 = lVar7 + 8;
      }
      auVar23._4_4_ = uVar1;
      auVar23._0_4_ = uVar1;
      auVar23._8_4_ = uVar1;
      auVar23._12_4_ = uVar1;
      auVar24._4_4_ = uVar2;
      auVar24._0_4_ = uVar2;
      auVar24._8_4_ = uVar2;
      auVar24._12_4_ = uVar2;
      for (; iVar10 + 3 < iVar6; iVar10 = iVar10 + 4) {
        auVar4 = vfmadd132ps_fma(*(undefined1 (*) [16])*pauVar13,auVar23,auVar24);
        *(undefined1 (*) [16])*pauVar13 = auVar4;
        pauVar13 = (undefined1 (*) [32])(*pauVar13 + 0x10);
        lVar7 = lVar7 + 4;
      }
      for (; (int)lVar7 < iVar6; lVar7 = lVar7 + 1) {
        auVar23 = vfmadd132ss_fma(ZEXT416(*(uint *)((undefined1 *)pvVar5 + lVar7 * 4)),auVar19,
                                  auVar21);
        *(int *)((undefined1 *)pvVar5 + lVar7 * 4) = auVar23._0_4_;
      }
    }
  }
  return 0;
}

Assistant:

int BatchNorm_x86_avx2::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;

    int elempack = bottom_top_blob.elempack;

#if __SSE2__
#if __AVX__
    if (elempack == 8)
    {
        if (dims == 1)
        {
            int w = bottom_top_blob.w;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < w; i++)
            {
                float* ptr = (float*)bottom_top_blob + i * 8;

                __m256 _a = _mm256_loadu_ps((const float*)a_data + i * 8);
                __m256 _b = _mm256_loadu_ps((const float*)b_data + i * 8);

                __m256 _p = _mm256_loadu_ps(ptr);
                _p = _mm256_comp_fmadd_ps(_p, _b, _a);
                _mm256_storeu_ps(ptr, _p);
            }
        }

        if (dims == 2)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                __m256 _a = _mm256_loadu_ps((const float*)a_data + i * 8);
                __m256 _b = _mm256_loadu_ps((const float*)b_data + i * 8);

                float* ptr = bottom_top_blob.row(i);

                for (int j = 0; j < w; j++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_comp_fmadd_ps(_p, _b, _a);
                    _mm256_storeu_ps(ptr, _p);

                    ptr += 8;
                }
            }
        }

        if (dims == 3 || dims == 4)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;
            int d = bottom_top_blob.d;
            int c = bottom_top_blob.c;
            int size = w * h * d;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < c; q++)
            {
                __m256 _a = _mm256_loadu_ps((const float*)a_data + q * 8);
                __m256 _b = _mm256_loadu_ps((const float*)b_data + q * 8);

                float* ptr = bottom_top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_comp_fmadd_ps(_p, _b, _a);
                    _mm256_storeu_ps(ptr, _p);

                    ptr += 8;
                }
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (dims == 1)
        {
            int w = bottom_top_blob.w;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < w; i++)
            {
                float* ptr = (float*)bottom_top_blob + i * 4;

                __m128 _a = _mm_load_ps((const float*)a_data + i * 4);
                __m128 _b = _mm_load_ps((const float*)b_data + i * 4);

                __m128 _p = _mm_load_ps(ptr);
                _p = _mm_mul_ps(_p, _b);
                _p = _mm_add_ps(_p, _a);
                _mm_store_ps(ptr, _p);
            }
        }

        if (dims == 2)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                __m128 _a = _mm_load_ps((const float*)a_data + i * 4);
                __m128 _b = _mm_load_ps((const float*)b_data + i * 4);

                float* ptr = bottom_top_blob.row(i);

                for (int j = 0; j < w; j++)
                {
                    __m128 _p = _mm_load_ps(ptr);
                    _p = _mm_mul_ps(_p, _b);
                    _p = _mm_add_ps(_p, _a);
                    _mm_store_ps(ptr, _p);

                    ptr += 4;
                }
            }
        }

        if (dims == 3 || dims == 4)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;
            int d = bottom_top_blob.d;
            int c = bottom_top_blob.c;
            int size = w * h * d;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < c; q++)
            {
                __m128 _a = _mm_load_ps((const float*)a_data + q * 4);
                __m128 _b = _mm_load_ps((const float*)b_data + q * 4);

                float* ptr = bottom_top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m128 _p = _mm_load_ps(ptr);
                    _p = _mm_mul_ps(_p, _b);
                    _p = _mm_add_ps(_p, _a);
                    _mm_store_ps(ptr, _p);

                    ptr += 4;
                }
            }
        }

        return 0;
    }
#endif // __SSE2__

    if (dims != 3 && dims != 4)
        return BatchNorm::forward_inplace(bottom_top_blob, opt);

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    // int c = bottom_top_blob.c;
    int size = w * h * d;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        float a = a_data[q];
        float b = b_data[q];

        int i = 0;
#if __SSE2__
#if __AVX__
        __m256 _a256 = _mm256_set1_ps(a);
        __m256 _b256 = _mm256_set1_ps(b);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = _mm256_comp_fmadd_ps(_p, _b256, _a256);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
        __m128 _a128 = _mm256_castps256_ps128(_a256);
        __m128 _b128 = _mm256_castps256_ps128(_b256);
#else
        __m128 _a128 = _mm_set1_ps(a);
        __m128 _b128 = _mm_set1_ps(b);
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = _mm_mul_ps(_p, _b128);
            _p = _mm_add_ps(_p, _a128);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = b * *ptr + a;

            ptr++;
        }
    }

    return 0;
}